

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svlogd.c
# Opt level: O1

void logmatch(logdir *ld)

{
  byte bVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  ld->match = '+';
  ld->matcherr = 'E';
  if ((ld->inst).len != 0) {
    uVar5 = 0;
    do {
      pcVar2 = (ld->inst).s;
      bVar1 = pcVar2[(int)uVar5];
      if (bVar1 < 0x45) {
        if (((bVar1 == 0x2b) || (bVar1 == 0x2d)) &&
           (iVar3 = pmatch(pcVar2 + (long)(int)uVar5 + 1,line,(uint)linelen), iVar3 != 0)) {
          ld->match = (ld->inst).s[(int)uVar5];
        }
      }
      else if (((bVar1 == 0x45) || (bVar1 == 0x65)) &&
              (iVar3 = pmatch(pcVar2 + (long)(int)uVar5 + 1,line,(uint)linelen), iVar3 != 0)) {
        ld->matcherr = (ld->inst).s[(int)uVar5];
      }
      uVar4 = byte_chr((ld->inst).s + (int)uVar5,(ld->inst).len - uVar5,0);
      uVar5 = uVar4 + uVar5 + 1;
    } while (uVar5 < (ld->inst).len);
  }
  return;
}

Assistant:

void logmatch(struct logdir *ld) {
  int i;

  ld->match ='+';
  ld->matcherr ='E';
  for (i =0; i < ld->inst.len; ++i) {
    switch(ld->inst.s[i]) {
    case '+':
    case '-':
      if (pmatch(&ld->inst.s[i +1], line, linelen))
        ld->match =ld->inst.s[i];
      break;
    case 'e':
    case 'E':
      if (pmatch(&ld->inst.s[i +1], line, linelen))
        ld->matcherr =ld->inst.s[i];
      break;
    }
    i +=byte_chr(&ld->inst.s[i], ld->inst.len -i, 0);
  }
}